

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

int __thiscall
google::protobuf::Reflection::FieldSize(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  CppStringType CVar4;
  RepeatedField<int> *this_00;
  RepeatedField<unsigned_long> *this_01;
  RepeatedField<absl::lts_20250127::Cord> *this_02;
  MapFieldBase *this_03;
  RepeatedPtrFieldBase *pRVar5;
  RepeatedField<long> *this_04;
  RepeatedField<unsigned_int> *this_05;
  RepeatedField<bool> *this_06;
  RepeatedField<double> *this_07;
  RepeatedField<float> *this_08;
  char *description;
  Descriptor *pDVar6;
  Metadata MVar7;
  LogMessage LStack_28;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
    pDVar6 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar6,MVar7.descriptor,field,"FieldSize");
  }
  pDVar6 = this->descriptor_;
  if (field->containing_type_ == pDVar6) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if ((field->field_0x1 & 8) != 0) {
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        iVar3 = internal::ExtensionSet::ExtensionSize
                          ((ExtensionSet *)
                           ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                           field->number_);
        return iVar3;
      }
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
      case 1:
      case 8:
        this_00 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
        iVar3 = RepeatedField<int>::size(this_00);
        return iVar3;
      case 2:
        this_04 = GetRaw<google::protobuf::RepeatedField<long>>(this,message,field);
        iVar3 = RepeatedField<long>::size(this_04);
        return iVar3;
      case 3:
        this_05 = GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
        iVar3 = RepeatedField<unsigned_int>::size(this_05);
        return iVar3;
      case 4:
        this_01 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
        iVar3 = RepeatedField<unsigned_long>::size(this_01);
        return iVar3;
      case 5:
        this_07 = GetRaw<google::protobuf::RepeatedField<double>>(this,message,field);
        iVar3 = RepeatedField<double>::size(this_07);
        return iVar3;
      case 6:
        this_08 = GetRaw<google::protobuf::RepeatedField<float>>(this,message,field);
        iVar3 = RepeatedField<float>::size(this_08);
        return iVar3;
      case 7:
        this_06 = GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
        iVar3 = RepeatedField<bool>::size(this_06);
        return iVar3;
      case 9:
        goto switchD_0034ce6d_caseD_9;
      case 10:
        goto switchD_0034ce6d_caseD_a;
      default:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&LStack_28,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x5ab);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&LStack_28,(char (*) [16])"Can\'t get here.");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&LStack_28);
      }
    }
    pDVar6 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar6,field,"FieldSize",description);
switchD_0034ce6d_caseD_9:
  CVar4 = FieldDescriptor::cpp_string_type(field);
  if (CVar4 == kCord) {
    this_02 = GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,message,field);
    iVar3 = RepeatedField<absl::lts_20250127::Cord>::size(this_02);
    return iVar3;
  }
switchD_0034ce6d_caseD_a:
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this_03 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
    bVar1 = internal::MapFieldBase::IsRepeatedFieldValid(this_03);
    if (!bVar1) {
      iVar3 = internal::MapFieldBase::size(this_03);
      return iVar3;
    }
    pRVar5 = internal::MapFieldBase::GetRepeatedField(this_03);
  }
  else {
    pRVar5 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
  }
  return pRVar5->current_size_;
}

Assistant:

int Reflection::FieldSize(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(FieldSize, &message);
  USAGE_CHECK_MESSAGE_TYPE(FieldSize);
  USAGE_CHECK_REPEATED(FieldSize);

  if (field->is_extension()) {
    return GetExtensionSet(message).ExtensionSize(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)    \
  case FieldDescriptor::CPPTYPE_##UPPERCASE: \
    return GetRaw<RepeatedField<LOWERCASE> >(message, field).size()

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          return GetRaw<RepeatedField<absl::Cord> >(message, field).size();
        }
        ABSL_FALLTHROUGH_INTENDED;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          const internal::MapFieldBase& map =
              GetRaw<MapFieldBase>(message, field);
          if (map.IsRepeatedFieldValid()) {
            return map.GetRepeatedField().size();
          } else {
            // No need to materialize the repeated field if it is out of sync:
            // its size will be the same as the map's size.
            return map.size();
          }
        } else {
          return GetRaw<RepeatedPtrFieldBase>(message, field).size();
        }
    }

    ABSL_LOG(FATAL) << "Can't get here.";
    return 0;
  }
}